

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_function.cpp
# Opt level: O1

spv_result_t spvtools::val::FunctionPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  size_t sVar3;
  pointer pIVar4;
  bool bVar5;
  ValidationState_t *this;
  EnumSet<spv::Capability> *this_00;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint32_t id;
  spv_result_t sVar11;
  AddressingModel AVar12;
  StorageClass SVar13;
  uint uVar14;
  uint id_00;
  uint32_t uVar15;
  Instruction *pIVar16;
  undefined4 *puVar17;
  __normal_iterator<const_spv::Op_*,_std::vector<spv::Op,_std::allocator<spv::Op>_>_> _Var18;
  Instruction *b;
  Instruction *pIVar19;
  long lVar20;
  long lVar21;
  pointer ppVar22;
  undefined4 *puVar23;
  char *pcVar24;
  undefined4 *puVar25;
  ulong uVar26;
  pointer pIVar27;
  pointer this_01;
  byte bVar28;
  string local_270;
  spv_result_t local_24c;
  ValidationState_t *local_248;
  pointer local_240;
  string local_238;
  EnumSet<spv::Capability> *local_218;
  Instruction *local_210;
  DiagnosticStream local_208;
  
  bVar28 = 0;
  uVar1 = (inst->inst_).opcode;
  if (uVar1 < 0x39) {
    if (uVar1 == 0x36) {
      uVar14 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar19 = ValidationState_t::FindDef(_,uVar14);
      if ((pIVar19 != (Instruction *)0x0) && ((pIVar19->inst_).opcode == 0x21)) {
        id = Instruction::GetOperandAs<unsigned_int>(pIVar19,1);
        if (id == (inst->inst_).type_id) {
          local_248 = _;
          puVar17 = (undefined4 *)operator_new(0x44);
          puVar23 = &DAT_007c4430;
          puVar25 = puVar17;
          for (lVar20 = 0x11; lVar20 != 0; lVar20 = lVar20 + -1) {
            *puVar25 = *puVar23;
            puVar23 = puVar23 + (ulong)bVar28 * -2 + 1;
            puVar25 = puVar25 + (ulong)bVar28 * -2 + 1;
          }
          ppVar22 = (inst->uses_).
                    super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_240 = (inst->uses_).
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          sVar11 = SPV_SUCCESS;
          if (ppVar22 != local_240) {
            do {
              pIVar19 = ppVar22->first;
              local_208._0_4_ = ZEXT24((pIVar19->inst_).opcode);
              _Var18 = std::
                       __find_if<__gnu_cxx::__normal_iterator<spv::Op_const*,std::vector<spv::Op,std::allocator<spv::Op>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Op_const>>
                                 (puVar17,puVar17 + 0x11,&local_208);
              if ((_Var18._M_current != puVar17 + 0x11) ||
                 (bVar6 = Instruction::IsNonSemantic(pIVar19), bVar6)) {
                bVar6 = true;
              }
              else {
                bVar7 = Instruction::IsDebugInfo(pIVar19);
                bVar6 = true;
                if (!bVar7) {
                  ValidationState_t::diag(&local_208,local_248,SPV_ERROR_INVALID_ID,pIVar19);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Invalid use of function result id ",0x22);
                  ValidationState_t::getIdName_abi_cxx11_
                            (&local_270,local_248,(inst->inst_).result_id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_270._M_dataplus._M_p,
                             local_270._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,".",1);
                  local_24c = local_208.error_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_270._M_dataplus._M_p != &local_270.field_2) {
                    operator_delete(local_270._M_dataplus._M_p,
                                    local_270.field_2._M_allocated_capacity + 1);
                  }
                  DiagnosticStream::~DiagnosticStream(&local_208);
                  bVar6 = false;
                }
              }
              sVar11 = local_24c;
            } while ((bVar6) && (ppVar22 = ppVar22 + 1, sVar11 = SPV_SUCCESS, ppVar22 != local_240))
            ;
          }
          operator_delete(puVar17,0x44);
          goto LAB_00682e82;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"OpFunction Result Type <id> ",0x1c);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar24 = " does not match the Function Type\'s return type <id> ";
        lVar20 = 0x35;
        goto LAB_006831b9;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunction Function Type <id> ",0x1e);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      pcVar24 = " is not a function type.";
      lVar20 = 0x18;
      goto LAB_00682d01;
    }
    if (uVar1 != 0x37) {
      return SPV_SUCCESS;
    }
    sVar3 = inst->line_num_;
    if (sVar3 - 1 == 0) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
      pcVar24 = "Function parameter cannot be the first instruction.";
      lVar20 = 0x33;
LAB_00682e6b:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar20);
      sVar11 = local_208.error_;
    }
    else {
      pIVar4 = (_->ordered_instructions_).
               super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = sVar3 - 2;
      if (lVar20 == 0) {
        uVar26 = 0;
        this_01 = pIVar4 + (sVar3 - 1);
      }
      else {
        pIVar27 = pIVar4 + (sVar3 - 2);
        uVar26 = 0;
        do {
          uVar2 = (pIVar27->inst_).opcode;
          this_01 = pIVar27;
          if (uVar2 == 0x36) break;
          uVar26 = uVar26 + (uVar2 == 0x37);
          pIVar27 = pIVar27 + -1;
          lVar20 = lVar20 + -1;
          this_01 = pIVar4 + 1;
        } while (lVar20 != 0);
      }
      if ((this_01->inst_).opcode != 0x36) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar24 = "Function parameter must be preceded by a function.";
        lVar20 = 0x32;
        goto LAB_00682e6b;
      }
      uVar14 = Instruction::GetOperandAs<unsigned_int>(this_01,3);
      pIVar19 = ValidationState_t::FindDef(_,uVar14);
      if (pIVar19 == (Instruction *)0x0) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Missing function type definition.",0x21);
        sVar11 = local_208.error_;
      }
      else {
        if (uVar26 < ((long)(pIVar19->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pIVar19->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) - 3U) {
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar19,uVar26 + 2);
          pIVar19 = ValidationState_t::FindDef(_,uVar14);
          if ((pIVar19 != (Instruction *)0x0) &&
             (sVar11 = SPV_SUCCESS, (inst->inst_).type_id == (pIVar19->inst_).result_id))
          goto LAB_00682e82;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"OpFunctionParameter Result Type <id> ",0x25);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          pcVar24 = " does not match the OpTypeFunction parameter type of the same index.";
          lVar20 = 0x44;
          goto LAB_00682d01;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Too many OpFunctionParameters for ",0x22);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,": expected ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208," based on the function\'s type",0x1d);
        sVar11 = local_208.error_;
      }
    }
  }
  else {
    if (uVar1 == 0x39) {
      uVar14 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar19 = ValidationState_t::FindDef(_,uVar14);
      if ((pIVar19 == (Instruction *)0x0) || ((pIVar19->inst_).opcode != 0x36)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar24 = "OpFunctionCall Function <id> ";
        lVar20 = 0x1d;
        goto LAB_00682ccc;
      }
      pIVar16 = ValidationState_t::FindDef(_,(pIVar19->inst_).type_id);
      if ((pIVar16 != (Instruction *)0x0) && ((pIVar16->inst_).result_id == (inst->inst_).type_id))
      {
        uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar19,3);
        local_210 = ValidationState_t::FindDef(_,uVar14);
        if ((local_210 == (Instruction *)0x0) || ((local_210->inst_).opcode != 0x21)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "Missing function type definition.";
          lVar20 = 0x21;
        }
        else {
          if ((long)(local_210->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(local_210->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2 ==
              ((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) + -1) {
            sVar11 = SPV_SUCCESS;
            if (0x30 < (ulong)((long)(inst->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(inst->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              local_218 = &_->module_capabilities_;
              lVar20 = 0;
              do {
                sVar11 = Instruction::GetOperandAs<unsigned_int>(inst,lVar20 + 3);
                pIVar19 = ValidationState_t::FindDef(_,sVar11);
                if (pIVar19 == (Instruction *)0x0) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,"Missing argument ",0x11);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                  lVar21 = 0xc;
                  pcVar24 = " definition.";
LAB_006829bc:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,pcVar24,lVar21);
                  local_240 = (pointer)CONCAT44(local_240._4_4_,local_208.error_);
LAB_00682ad6:
                  DiagnosticStream::~DiagnosticStream(&local_208);
                  bVar6 = false;
                }
                else {
                  pIVar16 = ValidationState_t::FindDef(_,(pIVar19->inst_).type_id);
                  if (pIVar16 == (Instruction *)0x0) {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"Missing argument ",0x11);
                    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                    lVar21 = 0x11;
                    pcVar24 = " type definition.";
                    goto LAB_006829bc;
                  }
                  local_24c = sVar11;
                  uVar14 = Instruction::GetOperandAs<unsigned_int>(local_210,lVar20 + 2);
                  local_248 = (ValidationState_t *)CONCAT44(local_248._4_4_,uVar14);
                  b = ValidationState_t::FindDef(_,uVar14);
                  if ((b == (Instruction *)0x0) ||
                     (((pIVar16->inst_).result_id != (b->inst_).result_id &&
                      ((_->options_->before_hlsl_legalization != true ||
                       (bVar6 = anon_unknown_2::DoPointeesLogicallyMatch(pIVar16,b,_), !bVar6))))))
                  {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"OpFunctionCall Argument <id> ",0x1d);
                    ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_24c);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,local_270._M_dataplus._M_p,
                               local_270._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
                    ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(uint32_t)local_248);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,local_238._M_dataplus._M_p,
                               local_238._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,"s parameter type.",0x11);
                    sVar11 = local_208.error_;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_238._M_dataplus._M_p != &local_238.field_2) {
                      operator_delete(local_238._M_dataplus._M_p,
                                      local_238.field_2._M_allocated_capacity + 1);
                    }
                    local_240 = (pointer)CONCAT44(local_240._4_4_,sVar11);
LAB_00682ab5:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_270._M_dataplus._M_p != &local_270.field_2) {
                      operator_delete(local_270._M_dataplus._M_p,
                                      local_270.field_2._M_allocated_capacity + 1);
                    }
                    goto LAB_00682ad6;
                  }
                  AVar12 = ValidationState_t::addressing_model(_);
                  bVar7 = true;
                  bVar5 = true;
                  bVar6 = bVar5;
                  if ((AVar12 == AddressingModelLogical) &&
                     (((uVar2 = (b->inst_).opcode, uVar2 == 0x1141 || (uVar2 == 0x20)) &&
                      (_->options_->relax_logical_pointer == false)))) {
                    SVar13 = Instruction::GetOperandAs<spv::StorageClass>(b,1);
                    this_00 = local_218;
                    if (StorageBuffer < SVar13) {
LAB_00682bc8:
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,"Invalid storage class for pointer operand ",
                                 0x2a);
                      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_24c);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,local_270._M_dataplus._M_p,
                                 local_270._M_string_length);
                      local_240 = (pointer)CONCAT44(local_240._4_4_,local_208.error_);
                      goto LAB_00682ab5;
                    }
                    if ((0x4d1U >> (SVar13 & 0x1f) & 1) == 0) {
                      if (SVar13 != StorageBuffer) goto LAB_00682bc8;
                      if ((_->features_).variable_pointers == false) {
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"StorageBuffer pointer operand ",0x1e);
                        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_24c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,local_270._M_dataplus._M_p,
                                   local_270._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," requires a variable pointers capability",
                                   0x28);
                        local_240 = (pointer)CONCAT44(local_240._4_4_,local_208.error_);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270._M_dataplus._M_p != &local_270.field_2) {
                          operator_delete(local_270._M_dataplus._M_p,
                                          local_270.field_2._M_allocated_capacity + 1);
                        }
                        DiagnosticStream::~DiagnosticStream(&local_208);
                        bVar6 = false;
                        goto LAB_00682ade;
                      }
                    }
                    uVar2 = (pIVar19->inst_).opcode;
                    if (((uVar2 != 0x37) && (uVar2 != 0x3b)) && (uVar2 != 0x1142)) {
                      local_248 = _;
                      bVar8 = EnumSet<spv::Capability>::contains
                                        (local_218,CapabilityVariablePointersStorageBuffer);
                      bVar9 = EnumSet<spv::Capability>::contains(this_00,CapabilityVariablePointers)
                      ;
                      this = local_248;
                      _ = local_248;
                      bVar6 = bVar7;
                      if (((SVar13 != StorageClassUniformConstant) &&
                          (SVar13 != StorageClassWorkgroup || !bVar9)) &&
                         ((SVar13 != StorageBuffer || !bVar8 &&
                          (bVar6 = bVar5, local_248->options_->before_hlsl_legalization == false))))
                      {
                        ValidationState_t::diag(&local_208,local_248,SPV_ERROR_INVALID_ID,inst);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Pointer operand ",0x10);
                        ValidationState_t::getIdName_abi_cxx11_(&local_270,this,local_24c);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,local_270._M_dataplus._M_p,
                                   local_270._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208," must be a memory object declaration",0x24
                                  );
                        local_240 = (pointer)CONCAT44(local_240._4_4_,local_208.error_);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_270._M_dataplus._M_p != &local_270.field_2) {
                          operator_delete(local_270._M_dataplus._M_p,
                                          local_270.field_2._M_allocated_capacity + 1);
                        }
                        DiagnosticStream::~DiagnosticStream(&local_208);
                        bVar6 = false;
                        _ = local_248;
                      }
                    }
                  }
                }
LAB_00682ade:
                if (!bVar6) {
                  sVar11 = (spv_result_t)local_240;
                  break;
                }
                uVar26 = lVar20 + 4;
                sVar11 = SPV_SUCCESS;
                lVar20 = lVar20 + 1;
              } while (uVar26 < (ulong)((long)(inst->operands_).
                                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(inst->operands_).
                                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 4));
            }
            goto LAB_00682e82;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = 
          "OpFunctionCall Function <id>\'s parameter count does not match the argument count.";
          lVar20 = 0x51;
        }
        goto LAB_00682e6b;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"OpFunctionCall Result Type <id> ",0x20);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"s type does not match Function <id> ",0x24);
      ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar16->inst_).result_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
      pcVar24 = "s return type.";
      lVar20 = 0xe;
LAB_006831ee:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar20);
      sVar11 = local_208.error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (uVar1 != 0x14f9) {
        return SPV_SUCCESS;
      }
      uVar14 = Instruction::GetOperandAs<unsigned_int>(inst,3);
      pIVar19 = ValidationState_t::FindDef(_,uVar14);
      if ((pIVar19 != (Instruction *)0x0) && ((pIVar19->inst_).opcode == 0x36)) {
        uVar14 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar16 = ValidationState_t::FindDef(_,uVar14);
        id = (pIVar16->inst_).type_id;
        bVar6 = ValidationState_t::IsCooperativeMatrixKHRType(_,id);
        if (!bVar6) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"OpCooperativeMatrixPerElementOpNV Matrix <id> ",0x2e);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          pcVar24 = " is not a cooperative matrix.";
          lVar20 = 0x1d;
          goto LAB_00682d01;
        }
        uVar14 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        if (id == uVar14) {
          pIVar16 = ValidationState_t::FindDef(_,id);
          id = Instruction::GetOperandAs<unsigned_int>(pIVar16,1);
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar19,3);
          pIVar19 = ValidationState_t::FindDef(_,uVar14);
          uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar19,1);
          if (uVar10 == id) {
            if (0x40 < (ulong)((long)(pIVar19->operands_).
                                     super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pIVar19->operands_).
                                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) {
              uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar19,2);
              uVar10 = Instruction::GetOperandAs<unsigned_int>(pIVar19,3);
              id_00 = Instruction::GetOperandAs<unsigned_int>(pIVar19,4);
              bVar6 = ValidationState_t::IsIntScalarType(_,uVar14);
              if ((bVar6) && (uVar15 = ValidationState_t::GetBitWidth(_,uVar14), uVar15 == 0x20)) {
                bVar6 = ValidationState_t::IsIntScalarType(_,uVar10);
                if ((!bVar6) || (uVar15 = ValidationState_t::GetBitWidth(_,uVar10), uVar15 != 0x20))
                {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,
                             "OpCooperativeMatrixPerElementOpNV function type second parameter type <id> "
                             ,0x4b);
                  ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar10);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_270._M_dataplus._M_p,
                             local_270._M_string_length);
                  pcVar24 = " must be a 32-bit integer.";
                  lVar20 = 0x1a;
                  goto LAB_006824d6;
                }
                sVar11 = SPV_SUCCESS;
                if (id_00 == id) goto LAB_00682e82;
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           "OpCooperativeMatrixPerElementOpNV function type third parameter type <id> "
                           ,0x4a);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,id_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                pcVar24 = " must match matrix component type.";
                lVar20 = 0x22;
              }
              else {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,
                           "OpCooperativeMatrixPerElementOpNV function type first parameter type <id> "
                           ,0x4a);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                pcVar24 = " must be a 32-bit integer.";
                lVar20 = 0x1a;
              }
              goto LAB_00682d01;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"OpCooperativeMatrixPerElementOpNV function type <id> "
                       ,0x35);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            pcVar24 = " must have a least three parameters.";
            lVar20 = 0x24;
LAB_006824d6:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar20)
            ;
            sVar11 = local_208.error_;
            goto LAB_00682d18;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,
                     "OpCooperativeMatrixPerElementOpNV function return type <id> ",0x3c);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          pcVar24 = " must match matrix component type <id> ";
          lVar20 = 0x27;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"OpCooperativeMatrixPerElementOpNV Result Type <id> ",
                     0x33);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          pcVar24 = " must match matrix type <id> ";
          lVar20 = 0x1d;
        }
LAB_006831b9:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar20);
        ValidationState_t::getIdName_abi_cxx11_(&local_238,_,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
        pcVar24 = ".";
        lVar20 = 1;
        goto LAB_006831ee;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpCooperativeMatrixPerElementOpNV Function <id> ";
      lVar20 = 0x30;
LAB_00682ccc:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar20);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      pcVar24 = " is not a function.";
      lVar20 = 0x13;
LAB_00682d01:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar24,lVar20);
      sVar11 = local_208.error_;
    }
LAB_00682d18:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  DiagnosticStream::~DiagnosticStream(&local_208);
LAB_00682e82:
  if (sVar11 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return sVar11;
}

Assistant:

spv_result_t FunctionPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpFunction:
      if (auto error = ValidateFunction(_, inst)) return error;
      break;
    case spv::Op::OpFunctionParameter:
      if (auto error = ValidateFunctionParameter(_, inst)) return error;
      break;
    case spv::Op::OpFunctionCall:
      if (auto error = ValidateFunctionCall(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixPerElementOpNV:
      if (auto error = ValidateCooperativeMatrixPerElementOp(_, inst))
        return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}